

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O2

void __thiscall jrtplib::RTPUDPv6Transmitter::GetLocalIPList_DNS(RTPUDPv6Transmitter *this)

{
  addrinfo *paVar1;
  int iVar2;
  addrinfo **__pai;
  addrinfo *res;
  char name [1024];
  addrinfo *local_450;
  addrinfo local_448;
  char local_418 [1023];
  undefined1 local_19;
  
  gethostname(local_418,0x3ff);
  local_19 = 0;
  local_448.ai_addrlen = 0;
  local_448._20_4_ = 0;
  local_448.ai_addr = (sockaddr *)0x0;
  local_448.ai_canonname = (char *)0x0;
  local_448.ai_next = (addrinfo *)0x0;
  local_448.ai_flags = 0;
  local_448.ai_family = 10;
  local_448.ai_socktype = 0;
  local_448.ai_protocol = 0;
  __pai = &local_450;
  iVar2 = getaddrinfo(local_418,(char *)0x0,&local_448,__pai);
  if (iVar2 == 0) {
    while (paVar1 = *__pai, paVar1 != (addrinfo *)0x0) {
      if (paVar1->ai_family == 10) {
        std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::push_back
                  (&this->localIPs,(value_type *)(paVar1->ai_addr->sa_data + 6));
      }
      __pai = &paVar1->ai_next;
    }
    freeaddrinfo(local_450);
  }
  return;
}

Assistant:

void RTPUDPv6Transmitter::GetLocalIPList_DNS()
{
	int status;
	char name[1024];

	gethostname(name,1023);
	name[1023] = 0;

	struct addrinfo hints;
	struct addrinfo *res,*tmp;
	
	memset(&hints,0,sizeof(struct addrinfo));
	hints.ai_family = AF_INET6;
	hints.ai_socktype = 0;
	hints.ai_protocol = 0;

	if ((status = getaddrinfo(name,0,&hints,&res)) != 0)
		return;

	tmp = res;
	while (tmp != 0)
	{
		if (tmp->ai_family == AF_INET6)
		{
			struct sockaddr_in6 *addr = (struct sockaddr_in6 *)(tmp->ai_addr);
			localIPs.push_back(addr->sin6_addr);
		}
		tmp = tmp->ai_next;
	}
	
	freeaddrinfo(res);	
}